

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxGetDefaultByType::Resolve(FxGetDefaultByType *this,FCompileContext *ctx)

{
  undefined8 val;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  FxConstant *pFVar4;
  PClassPointer *pPVar5;
  char *pcVar6;
  PPointer *pPVar7;
  PClassPointer *cp;
  undefined1 local_70 [8];
  undefined1 local_68 [16];
  ExpVal local_58;
  undefined1 local_40 [20];
  undefined1 local_2c [12];
  PClass *cls;
  FCompileContext *ctx_local;
  FxGetDefaultByType *this_local;
  
  cls = (PClass *)ctx;
  ctx_local = (FCompileContext *)this;
  if (this->Self != (FxExpression *)0x0) {
    iVar2 = (*this->Self->_vptr_FxExpression[2])(this->Self,ctx);
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar2);
  }
  if (this->Self == (FxExpression *)0x0) {
    if (this != (FxGetDefaultByType *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    return (FxExpression *)0x0;
  }
  local_2c._4_8_ = 0;
  if ((this->Self->ValueType == (PType *)TypeString) || (this->Self->ValueType == (PType *)TypeName)
     ) {
    uVar3 = (*this->Self->_vptr_FxExpression[3])();
    if ((uVar3 & 1) == 0) {
      FxConstant::GetValue((FxConstant *)&cp);
      ExpVal::GetString((ExpVal *)local_70);
      pcVar6 = FString::GetChars((FString *)local_70);
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "GetDefaultByType() requires an actor class type, but got %s",pcVar6);
      FString::~FString((FString *)local_70);
      ExpVal::~ExpVal((ExpVal *)&cp);
      if (this != (FxGetDefaultByType *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
    pFVar4 = (FxConstant *)(local_68 + 0x28);
    FxConstant::GetValue(pFVar4);
    ExpVal::GetName((ExpVal *)local_2c);
    local_2c._4_8_ = PClass::FindActor((FName *)local_2c);
    ExpVal::~ExpVal((ExpVal *)(local_68 + 0x28));
    if ((PClassActor *)local_2c._4_8_ == (PClassActor *)0x0) {
      FxConstant::GetValue((FxConstant *)local_68);
      ExpVal::GetString((ExpVal *)(local_68 + 0x10));
      pcVar6 = FString::GetChars((FString *)(local_68 + 0x10));
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "GetDefaultByType() requires an actor class type, but got %s",pcVar6);
      FString::~FString((FString *)(local_68 + 0x10));
      ExpVal::~ExpVal((ExpVal *)local_68);
      if (this != (FxGetDefaultByType *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
    pFVar4 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar4);
    val = local_2c._4_8_;
    pPVar5 = NewClassPointer((PClass *)local_2c._4_8_);
    FxConstant::FxConstant(pFVar4,(PClass *)val,pPVar5,&(this->super_FxExpression).ScriptPosition);
    this->Self = (FxExpression *)pFVar4;
  }
  else {
    pPVar5 = dyn_cast<PClassPointer>((DObject *)this->Self->ValueType);
    if ((pPVar5 == (PClassPointer *)0x0) ||
       (bVar1 = PClass::IsDescendantOf(pPVar5->ClassRestriction,AActor::RegistrationInfo.MyClass),
       !bVar1)) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "GetDefaultByType() requires an actor class type");
      if (this != (FxGetDefaultByType *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
    local_2c._4_8_ = pPVar5->ClassRestriction;
  }
  pPVar7 = NewPointer((PType *)local_2c._4_8_,true);
  (this->super_FxExpression).ValueType = (PType *)pPVar7;
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxGetDefaultByType::Resolve(FCompileContext &ctx)
{
	SAFE_RESOLVE(Self, ctx);
	PClass *cls = nullptr;

	if (Self->ValueType == TypeString || Self->ValueType == TypeName)
	{
		if (Self->isConstant())
		{
			cls = PClass::FindActor(static_cast<FxConstant *>(Self)->GetValue().GetName());
			if (cls == nullptr)
			{
				ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type, but got %s", static_cast<FxConstant *>(Self)->GetValue().GetString().GetChars());
				delete this;
				return nullptr;
			}
			Self = new FxConstant(cls, NewClassPointer(cls), ScriptPosition);
		}
		else
		{
			// this is the ugly case. We do not know what we have and cannot do proper type casting.
			// For now error out and let this case require explicit handling on the user side.
			ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type, but got %s", static_cast<FxConstant *>(Self)->GetValue().GetString().GetChars());
			delete this;
			return nullptr;
		}
	}
	else
	{
		auto cp = dyn_cast<PClassPointer>(Self->ValueType);
		if (cp == nullptr || !cp->ClassRestriction->IsDescendantOf(RUNTIME_CLASS(AActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type");
			delete this;
			return nullptr;
		}
		cls = cp->ClassRestriction;
	}
	ValueType = NewPointer(cls, true);
	return this;
}